

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  bool bVar1;
  int iVar2;
  Level level;
  ConfigurationType CVar3;
  Level LVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unsigned_long uVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference ppCVar6;
  string *psVar7;
  reference ppCVar8;
  PreRollOutCallback local_2d0;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_2b0;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_2a8;
  iterator conf_2;
  Configuration *conf_1;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_290;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_288;
  const_iterator it_1;
  unsigned_long local_260;
  unsigned_long local_258;
  string local_250;
  unsigned_long local_230;
  unsigned_long v;
  bool local_201;
  string local_200;
  SubsecondPrecision local_1dc;
  allocator<char> local_1d1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  string_t local_1c0;
  LogFormat local_1a0;
  string local_e8;
  bool local_c1;
  string local_c0;
  bool local_99;
  string local_98;
  bool local_71;
  Configuration *local_70;
  Configuration *conf;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_50;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_48;
  const_iterator it;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  anon_class_1_0_00000001 getBool;
  ScopedLock scopedLock;
  Configurations *configurations_local;
  TypedConfigurations *this_local;
  
  iVar2 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffe0,
             (NoMutex *)CONCAT44(extraout_var,iVar2));
  utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::vector
            ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)&it);
  iVar2 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])();
  local_50._M_current = (Configuration **)CONCAT44(extraout_var_00,iVar2);
  __gnu_cxx::
  __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
  ::__normal_iterator<el::Configuration**>
            ((__normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
              *)&local_48,&local_50);
  while( true ) {
    iVar2 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])();
    conf = (Configuration *)CONCAT44(extraout_var_01,iVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)&conf);
    if (!bVar1) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_48);
    local_70 = *ppCVar6;
    CVar3 = Configuration::configurationType(local_70);
    if (CVar3 == Enabled) {
      LVar4 = Configuration::level(local_70);
      psVar7 = Configuration::value_abi_cxx11_(local_70);
      std::__cxx11::string::string((string *)&local_98,(string *)psVar7);
      local_71 = build::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)
                            ((long)&withFileSizeLimit.
                                    super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                            &local_98);
      setValue<bool>(this,LVar4,&local_71,&this->m_enabledMap,true);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      CVar3 = Configuration::configurationType(local_70);
      if (CVar3 == ToFile) {
        LVar4 = Configuration::level(local_70);
        psVar7 = Configuration::value_abi_cxx11_(local_70);
        std::__cxx11::string::string((string *)&local_c0,(string *)psVar7);
        local_99 = build::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)
                              ((long)&withFileSizeLimit.
                                      super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                              &local_c0);
        setValue<bool>(this,LVar4,&local_99,&this->m_toFileMap,true);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        CVar3 = Configuration::configurationType(local_70);
        if (CVar3 == ToStandardOutput) {
          LVar4 = Configuration::level(local_70);
          psVar7 = Configuration::value_abi_cxx11_(local_70);
          std::__cxx11::string::string((string *)&local_e8,(string *)psVar7);
          local_c1 = build::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)
                                ((long)&withFileSizeLimit.
                                        super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                                &local_e8);
          setValue<bool>(this,LVar4,&local_c1,&this->m_toStandardOutputMap,true);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        else {
          CVar3 = Configuration::configurationType(local_70);
          if (CVar3 != Filename) {
            CVar3 = Configuration::configurationType(local_70);
            if (CVar3 == Format) {
              LVar4 = Configuration::level(local_70);
              level = Configuration::level(local_70);
              Configuration::value_abi_cxx11_(local_70);
              local_1c8._M_current = (char *)std::__cxx11::string::begin();
              Configuration::value_abi_cxx11_(local_70);
              local_1d0._M_current = (char *)std::__cxx11::string::end();
              std::allocator<char>::allocator();
              std::__cxx11::string::
              string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        ((string *)&local_1c0,local_1c8,local_1d0,&local_1d1);
              LogFormat::LogFormat(&local_1a0,level,&local_1c0);
              setValue<el::base::LogFormat>(this,LVar4,&local_1a0,&this->m_logFormatMap,true);
              LogFormat::~LogFormat(&local_1a0);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            }
            else {
              CVar3 = Configuration::configurationType(local_70);
              if (CVar3 == MillisecondsWidth) {
                psVar7 = Configuration::value_abi_cxx11_(local_70);
                std::__cxx11::string::string((string *)&local_200,(string *)psVar7);
                uVar5 = getULong(this,&local_200);
                SubsecondPrecision::SubsecondPrecision(&local_1dc,(int)uVar5);
                setValue<el::base::SubsecondPrecision>
                          (this,Global,&local_1dc,&this->m_subsecondPrecisionMap,true);
                std::__cxx11::string::~string((string *)&local_200);
              }
              else {
                CVar3 = Configuration::configurationType(local_70);
                if (CVar3 == PerformanceTracking) {
                  psVar7 = Configuration::value_abi_cxx11_(local_70);
                  std::__cxx11::string::string((string *)&v,(string *)psVar7);
                  local_201 = build::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)
                                         ((long)&withFileSizeLimit.
                                                 super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 7),(string *)&v);
                  setValue<bool>(this,Global,&local_201,&this->m_performanceTrackingMap,true);
                  std::__cxx11::string::~string((string *)&v);
                }
                else {
                  CVar3 = Configuration::configurationType(local_70);
                  if (CVar3 == MaxLogFileSize) {
                    psVar7 = Configuration::value_abi_cxx11_(local_70);
                    std::__cxx11::string::string((string *)&local_250,(string *)psVar7);
                    uVar5 = getULong(this,&local_250);
                    std::__cxx11::string::~string((string *)&local_250);
                    local_230 = uVar5;
                    LVar4 = Configuration::level(local_70);
                    local_258 = local_230;
                    setValue<unsigned_long>(this,LVar4,&local_258,&this->m_maxLogFileSizeMap,true);
                    if (local_230 != 0) {
                      utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                      ::push_back((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                                   *)&it,&local_70);
                    }
                  }
                  else {
                    CVar3 = Configuration::configurationType(local_70);
                    if (CVar3 == LogFlushThreshold) {
                      LVar4 = Configuration::level(local_70);
                      psVar7 = Configuration::value_abi_cxx11_(local_70);
                      std::__cxx11::string::string((string *)&it_1,(string *)psVar7);
                      local_260 = getULong(this,(string *)&it_1);
                      setValue<unsigned_long>
                                (this,LVar4,&local_260,&this->m_logFlushThresholdMap,true);
                      std::__cxx11::string::~string((string *)&it_1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(&local_48);
  }
  iVar2 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])();
  local_290._M_current = (Configuration **)CONCAT44(extraout_var_02,iVar2);
  __gnu_cxx::
  __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
  ::__normal_iterator<el::Configuration**>
            ((__normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
              *)&local_288,&local_290);
  while( true ) {
    iVar2 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])();
    conf_1 = (Configuration *)CONCAT44(extraout_var_03,iVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_288,
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)&conf_1);
    if (!bVar1) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_288);
    conf_2._M_current = (Configuration **)*ppCVar6;
    CVar3 = Configuration::configurationType((Configuration *)conf_2._M_current);
    if (CVar3 == Filename) {
      LVar4 = Configuration::level((Configuration *)conf_2._M_current);
      psVar7 = Configuration::value_abi_cxx11_((Configuration *)conf_2._M_current);
      insertFile(this,LVar4,psVar7);
    }
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(&local_288);
  }
  local_2a8._M_current =
       (Configuration **)
       utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin
                 ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)&it);
  while( true ) {
    local_2b0._M_current =
         (Configuration **)
         utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end
                   ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)&it);
    bVar1 = __gnu_cxx::operator!=(&local_2a8,&local_2b0);
    if (!bVar1) break;
    ppCVar8 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_2a8);
    LVar4 = Configuration::level(*ppCVar8);
    std::function<void(char_const*,unsigned_long)>::
    function<void(&)(char_const*,unsigned_long),void>
              ((function<void(char_const*,unsigned_long)> *)&local_2d0,defaultPreRollOutCallback);
    unsafeValidateFileRolling(this,LVar4,&local_2d0);
    utils::std::function<void_(const_char_*,_unsigned_long)>::~function(&local_2d0);
    __gnu_cxx::
    __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(&local_2a8);
  }
  utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::~vector
            ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)&it);
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      auto v = getULong(conf->value());
      setValue(conf->level(), static_cast<std::size_t>(v), &m_maxLogFileSizeMap);
      if (v != 0) {
        withFileSizeLimit.push_back(conf);
      }
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}